

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::ProcessPackageResult
          (PeerManagerImpl *this,PackageToValidate *package_to_validate,
          PackageMempoolAcceptResult *package_result)

{
  long lVar1;
  Span<const_unsigned_char> vKey;
  bool bVar2;
  size_type sVar3;
  bool *pbVar4;
  pointer ppVar5;
  long in_RDX;
  bool *in_RDI;
  long in_FS_OFFSET;
  undefined1 uVar6;
  NodeId in_stack_00000018;
  MempoolAcceptResult *tx_result;
  NodeId nodeid;
  shared_ptr<const_CTransaction> *tx;
  vector<long,_std::allocator<long>_> *senders;
  Package *package;
  const_iterator it_result;
  const_reverse_iterator senders_iter;
  const_reverse_iterator package_iter;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  PeerManagerImpl *in_stack_ffffffffffffff20;
  Span<const_unsigned_char> *in_stack_ffffffffffffff28;
  CRollingBloomFilter *in_stack_ffffffffffffff30;
  CRollingBloomFilter *in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffffa0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  TxValidationState *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  PeerManagerImpl *in_stack_ffffffffffffffc8;
  PeerManagerImpl *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,(Mutex *)0x108e940);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,(AnnotatedMixin<std::mutex> *)0x108e95f);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,(AnnotatedMixin<std::mutex> *)0x108e983);
  bVar2 = ValidationState<PackageValidationResult>::IsInvalid
                    ((ValidationState<PackageValidationResult> *)
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (bVar2) {
    in_stack_ffffffffffffff30 = RecentRejectsReconsiderableFilter(in_stack_ffffffffffffff20);
    GetPackageHash(in_stack_ffffffffffffffa8);
    Span<const_unsigned_char>::Span<uint256>
              (in_stack_ffffffffffffff28,(uint256 *)in_stack_ffffffffffffff20,
               (type)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    vKey.m_size = (size_t)in_stack_ffffffffffffffa8;
    vKey.m_data = in_stack_ffffffffffffffa0;
    CRollingBloomFilter::insert(in_stack_ffffffffffffff88,vKey);
  }
  sVar3 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  uVar6 = sVar3 == 2;
  pbVar4 = inline_assertion_check<false,bool>
                     (in_RDI,(char *)in_stack_ffffffffffffff30,
                      (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                      (char *)in_stack_ffffffffffffff20,
                      (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (((*pbVar4 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::rbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffff30);
    std::vector<long,_std::allocator<long>_>::rbegin
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff30);
    while( true ) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::rend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffff30);
      bVar2 = std::
              operator==<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                          *)in_stack_ffffffffffffff28,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                          *)in_stack_ffffffffffffff20);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                   *)in_stack_ffffffffffffff20);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                   *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff28 = (Span<const_unsigned_char> *)(in_RDX + 0x48);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<true> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
              *)in_stack_ffffffffffffff20,
             (key_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::
      map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::end((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
             *)in_stack_ffffffffffffff20);
      bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff28,(_Self *)in_stack_ffffffffffffff20)
      ;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>
                             *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff20 = (PeerManagerImpl *)(ulong)(ppVar5->second).m_result_type;
        switch(in_stack_ffffffffffffff20) {
        case (PeerManagerImpl *)0x0:
          ProcessValidTx(in_stack_ffffffffffffffd0,in_stack_00000018,
                         (CTransactionRef *)in_stack_ffffffffffffffc8,
                         (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)CONCAT17(uVar6,in_stack_ffffffffffffffc0));
          break;
        case (PeerManagerImpl *)0x1:
        case (PeerManagerImpl *)0x3:
          ProcessInvalidTx(in_stack_ffffffffffffffc8,(NodeId)package,
                           (CTransactionRef *)CONCAT17(uVar6,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
          break;
        case (PeerManagerImpl *)0x2:
          inline_assertion_check<false,bool>
                    (in_RDI,(char *)in_stack_ffffffffffffff30,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                     (char *)in_stack_ffffffffffffff20,
                     (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>_>
                    *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
                    *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessPackageResult(const PackageToValidate& package_to_validate, const PackageMempoolAcceptResult& package_result)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    const auto& package = package_to_validate.m_txns;
    const auto& senders = package_to_validate.m_senders;

    if (package_result.m_state.IsInvalid()) {
        RecentRejectsReconsiderableFilter().insert(GetPackageHash(package));
    }
    // We currently only expect to process 1-parent-1-child packages. Remove if this changes.
    if (!Assume(package.size() == 2)) return;

    // Iterate backwards to erase in-package descendants from the orphanage before they become
    // relevant in AddChildrenToWorkSet.
    auto package_iter = package.rbegin();
    auto senders_iter = senders.rbegin();
    while (package_iter != package.rend()) {
        const auto& tx = *package_iter;
        const NodeId nodeid = *senders_iter;
        const auto it_result{package_result.m_tx_results.find(tx->GetWitnessHash())};

        // It is not guaranteed that a result exists for every transaction.
        if (it_result != package_result.m_tx_results.end()) {
            const auto& tx_result = it_result->second;
            switch (tx_result.m_result_type) {
                case MempoolAcceptResult::ResultType::VALID:
                {
                    ProcessValidTx(nodeid, tx, tx_result.m_replaced_transactions);
                    break;
                }
                case MempoolAcceptResult::ResultType::INVALID:
                case MempoolAcceptResult::ResultType::DIFFERENT_WITNESS:
                {
                    // Don't add to vExtraTxnForCompact, as these transactions should have already been
                    // added there when added to the orphanage or rejected for TX_RECONSIDERABLE.
                    // This should be updated if package submission is ever used for transactions
                    // that haven't already been validated before.
                    ProcessInvalidTx(nodeid, tx, tx_result.m_state, /*maybe_add_extra_compact_tx=*/false);
                    break;
                }
                case MempoolAcceptResult::ResultType::MEMPOOL_ENTRY:
                {
                    // AlreadyHaveTx() should be catching transactions that are already in mempool.
                    Assume(false);
                    break;
                }
            }
        }
        package_iter++;
        senders_iter++;
    }
}